

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassBuilder.cpp
# Opt level: O0

ClassBuilder * __thiscall Lodtalk::ClassBuilder::setName(ClassBuilder *this,char *name)

{
  VMContext *pVVar1;
  anon_union_8_4_0eb573b0_for_Oop_0 symbol;
  Class *pCVar2;
  Oop value;
  allocator local_41;
  string local_40;
  anon_union_8_4_0eb573b0_for_Oop_0 local_20;
  char *local_18;
  char *name_local;
  ClassBuilder *this_local;
  
  pVVar1 = this->context;
  local_18 = name;
  name_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,name,&local_41);
  local_20 = (anon_union_8_4_0eb573b0_for_Oop_0)ByteSymbol::fromNative(pVVar1,&local_40);
  pCVar2 = Ref<Lodtalk::Class>::operator->(&this->clazz);
  (pCVar2->name).field_0 = local_20;
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  pVVar1 = this->context;
  pCVar2 = Ref<Lodtalk::Class>::operator->(&this->clazz);
  symbol = (pCVar2->name).field_0;
  value = Ref<Lodtalk::Class>::getOop(&this->clazz);
  VMContext::setGlobalVariable(pVVar1,(Oop)symbol,value);
  return this;
}

Assistant:

ClassBuilder &ClassBuilder::setName(const char *name)
{
    clazz->name = ByteSymbol::fromNative(context, name);
    context->setGlobalVariable(clazz->name, clazz.getOop());
    return *this;
}